

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::MotionVectorTestLarge_OverallTest_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::MotionVectorTestLarge_OverallTest_Test>
           *this)

{
  Test *this_00;
  ParamType *pPVar1;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int>>::
  parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x400);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,_int,_int>::CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,_int,_int> *)this_00);
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
           ::GetParam();
  (((__uniq_ptr_data<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>,_true,_true>
     *)&this_00[2]._vptr_Test)->
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  )._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>).
       super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
  *(undefined1 *)
   &this_00[2].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0;
  (((TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
     *)&this_00[0x3c]._vptr_Test)->super_Test)._vptr_Test = (_func_int **)(this_00 + 0x3d);
  this_00[0x3c].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined1 *)&this_00[0x3d]._vptr_Test = 0;
  *(undefined4 *)
   &(((TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
       *)&this_00[0x3f]._vptr_Test)->super_Test)._vptr_Test = 0;
  (((__uniq_ptr_data<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>,_true,_true>
     *)&this_00[0x3e]._vptr_Test)->
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  )._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  this_00[0x3e].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined4 *)
   ((long)&(((TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
              *)&this_00[3]._vptr_Test)->super_Test)._vptr_Test + 4) = 1;
  (((TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
     *)&this_00->_vptr_Test)->super_Test)._vptr_Test =
       (_func_int **)&PTR__MotionVectorTestLarge_00f56028;
  this_00[1]._vptr_Test = (_func_int **)&PTR__MotionVectorTestLarge_00f56070;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__MotionVectorTestLarge_00f56090;
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
           ::GetParam();
  *(TestMode *)
   ((long)&(((TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
              *)&this_00[0x3f]._vptr_Test)->super_Test)._vptr_Test + 4) =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>).
       super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_int>.
       super__Head_base<1UL,_libaom_test::TestMode,_false>._M_head_impl;
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
           ::GetParam();
  *(int *)&this_00[0x3f].gtest_flag_saver_._M_t.
           super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
           .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>).
       super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
       super__Head_base<2UL,_int,_false>._M_head_impl;
  pPVar1 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
           ::GetParam();
  *(int *)((long)&this_00[0x3f].gtest_flag_saver_._M_t.
                  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl +
          4) = (pPVar1->
               super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>
               ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_int>.
               super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
               super__Head_base<3UL,_int,_false>._M_head_impl;
  (((TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
     *)&this_00->_vptr_Test)->super_Test)._vptr_Test =
       (_func_int **)&PTR__MotionVectorTestLarge_00f55ec8;
  this_00[1]._vptr_Test = (_func_int **)&PTR__MotionVectorTestLarge_OverallTest_Test_00f55f10;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__MotionVectorTestLarge_OverallTest_Test_00f55f30;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }